

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayDisposer::dispose<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>
          (ArrayDisposer *this,ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *firstElement,
          size_t elementCount,size_t capacity)

{
  size_t capacity_local;
  size_t elementCount_local;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *firstElement_local;
  ArrayDisposer *this_local;
  
  (**this->_vptr_ArrayDisposer)(this,firstElement,0x10,elementCount,capacity,0);
  return;
}

Assistant:

void ArrayDisposer::dispose(T* firstElement, size_t elementCount, size_t capacity) const {
  if constexpr (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, nullptr);
  } else {
    disposeImpl(const_cast<RemoveConst<T>*>(firstElement),
                         sizeof(T), elementCount, capacity, &Dispose_<T>::destruct);
  }
}